

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fBasicComputeShaderTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_2::ImageBarrierCase::iterate(ImageBarrierCase *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type *__x;
  undefined1 *puVar2;
  RenderContext *pRVar3;
  glUniform1uiFunc p_Var4;
  ContextType type;
  GLSLVersion version;
  int iVar5;
  GLenum GVar6;
  GLuint GVar7;
  deUint32 dVar8;
  GLint GVar9;
  char *__s;
  size_t sVar10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ObjectTraits *pOVar11;
  undefined4 extraout_var_01;
  TestLog *log;
  TestError *pTVar12;
  int iVar13;
  long lVar14;
  Texture tempTexture;
  InterfaceVariableInfo valueInfo;
  BufferMemMap bufMap_1;
  Buffer outputBuffer;
  ShaderProgram program1;
  BufferMemMap bufMap;
  ShaderProgram program0;
  ostringstream src1;
  ostringstream src0;
  undefined1 local_6e0 [32];
  InterfaceVariableInfo local_6c0;
  BufferMemMap local_670;
  ObjectWrapper local_658;
  undefined1 local_640 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_628 [8];
  GLuint local_5a8;
  bool local_580;
  undefined1 local_570 [8];
  deUint32 local_568;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_560 [6];
  ios_base local_4f8 [24];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_4e0;
  undefined1 local_4c0 [208];
  ShaderProgram local_3f0;
  undefined1 local_320 [376];
  undefined1 local_1a8 [376];
  Functions *gl;
  
  type.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  version = glu::getContextTypeGLSLVersion(type);
  __s = glu::getGLSLVersionDeclaration(version);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  if (__s == (char *)0x0) {
    std::ios::clear((int)&stack0xfffffffffffff918 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18) +
                    0x540);
  }
  else {
    sVar10 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,__s,sVar10);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,
             "layout (local_size_x = 1) in;\nuniform uint u_baseVal;\nlayout(r32ui, binding = 2) writeonly uniform highp uimage2D u_img;\nvoid main (void) {\n    uint offset = gl_NumWorkGroups.x*gl_NumWorkGroups.y*gl_WorkGroupID.z + gl_NumWorkGroups.x*gl_WorkGroupID.y + gl_WorkGroupID.x;\n    imageStore(u_img, ivec2(gl_WorkGroupID.xy), uvec4(offset+u_baseVal, 0, 0, 0));\n}\n"
             ,0x164);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
  if (__s == (char *)0x0) {
    std::ios::clear((int)&stack0xfffffffffffff918 + (int)*(_func_int **)(local_320._0_8_ + -0x18) +
                    0x3c8);
  }
  else {
    sVar10 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,__s,sVar10);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_320,
             "layout (local_size_x = 1) in;\nlayout(r32ui, binding = 2) readonly uniform highp uimage2D u_img;\nlayout(binding = 0) buffer Output {\n    coherent uint sum;\n};\nvoid main (void) {\n    uint value = imageLoad(u_img, ivec2(gl_WorkGroupID.xy)).x;\n    atomicAdd(sum, value);\n}\n"
             ,0x10d);
  pRVar3 = ((this->super_TestCase).m_context)->m_renderCtx;
  local_4c0[0x10] = 0;
  local_4c0._17_8_ = 0;
  local_4c0._0_8_ = (pointer)0x0;
  local_4c0[8] = 0;
  local_4c0._9_7_ = 0;
  memset(local_570,0,0xac);
  std::__cxx11::stringbuf::str();
  local_640._0_4_ = 5;
  local_640._8_8_ = local_628;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_640 + 8),local_6c0.name._M_dataplus._M_p,
             local_6c0.name._M_dataplus._M_p + local_6c0.name._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_570 + (ulong)(uint)local_640._0_4_ * 0x18),(value_type *)(local_640 + 8));
  glu::ShaderProgram::ShaderProgram(&local_3f0,pRVar3,(ProgramSources *)local_570);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_640._8_8_ != local_628) {
    operator_delete((void *)local_640._8_8_,local_628[0]._M_allocated_capacity + 1);
  }
  paVar1 = &local_6c0.name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6c0.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_6c0.name._M_dataplus._M_p,
                    CONCAT71(local_6c0.name.field_2._M_allocated_capacity._1_7_,
                             local_6c0.name.field_2._M_local_buf[0]) + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_4c0);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_4e0);
  lVar14 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_570 + lVar14));
    lVar14 = lVar14 + -0x18;
  } while (lVar14 != -0x18);
  pRVar3 = ((this->super_TestCase).m_context)->m_renderCtx;
  local_4c0[0x10] = 0;
  local_4c0._17_8_ = 0;
  local_4c0._0_8_ = (pointer)0x0;
  local_4c0[8] = 0;
  local_4c0._9_7_ = 0;
  memset(local_570,0,0xac);
  std::__cxx11::stringbuf::str();
  __x = &local_6c0.name._M_string_length;
  local_6c0.name._M_dataplus._M_p._0_4_ = 5;
  puVar2 = (undefined1 *)((long)&local_6c0.name.field_2 + 8);
  local_6c0.name._M_string_length = (size_type)puVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__x,local_6e0._0_8_,
             (undefined1 *)
             ((long)(glActiveShaderProgramFunc *)local_6e0._0_8_ + (long)(char **)local_6e0._8_8_));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_570 + ((ulong)local_6c0.name._M_dataplus._M_p & 0xffffffff) * 0x18),
              (value_type *)__x);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_640,pRVar3,(ProgramSources *)local_570);
  if ((undefined1 *)local_6c0.name._M_string_length != puVar2) {
    operator_delete((void *)local_6c0.name._M_string_length,local_6c0.name.field_2._8_8_ + 1);
  }
  if ((Functions *)local_6e0._0_8_ != (Functions *)(local_6e0 + 0x10)) {
    operator_delete((void *)local_6e0._0_8_,CONCAT44(local_6e0._20_4_,local_6e0._16_4_) + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_4c0);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_4e0);
  lVar14 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_570 + lVar14));
    lVar14 = lVar14 + -0x18;
  } while (lVar14 != -0x18);
  iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  gl = (Functions *)CONCAT44(extraout_var,iVar5);
  iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  pOVar11 = glu::objectTraits(OBJECTTYPE_TEXTURE);
  glu::ObjectWrapper::ObjectWrapper
            ((ObjectWrapper *)local_6e0,(Functions *)CONCAT44(extraout_var_00,iVar5),pOVar11);
  iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  pOVar11 = glu::objectTraits(OBJECTTYPE_BUFFER);
  glu::ObjectWrapper::ObjectWrapper(&local_658,(Functions *)CONCAT44(extraout_var_01,iVar5),pOVar11)
  ;
  log = glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                        &local_3f0);
  glu::operator<<(log,(ShaderProgram *)local_640);
  if ((local_3f0.m_program.m_info.linkOk == true) && (local_580 != false)) {
    local_570 = (undefined1  [8])
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_568);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_568,"Work groups: ",0xd);
    tcu::operator<<((ostream *)&local_568,&this->m_workSize);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_570,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_568);
    std::ios_base::~ios_base(local_4f8);
    (*gl->bindTexture)(0xde1,local_6e0._16_4_);
    (*gl->texStorage2D)(0xde1,1,0x8236,(this->m_workSize).m_data[0],(this->m_workSize).m_data[1]);
    (*gl->texParameteri)(0xde1,0x2801,0x2600);
    (*gl->texParameteri)(0xde1,0x2800,0x2600);
    GVar6 = (*gl->getError)();
    glu::checkError(GVar6,"Uploading image data failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fBasicComputeShaderTests.cpp"
                    ,0x58b);
    (*gl->bindImageTexture)(2,local_6e0._16_4_,0,'\0',0,0x88ba,0x8236);
    GVar6 = (*gl->getError)();
    glu::checkError(GVar6,"Image setup failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fBasicComputeShaderTests.cpp"
                    ,0x58f);
    GVar7 = (*gl->getProgramResourceIndex)(local_5a8,0x92e6,"Output");
    dVar8 = glu::getProgramResourceUint(gl,local_5a8,0x92e6,GVar7,0x9303);
    (*gl->bindBuffer)(0x90d2,local_658.m_object);
    (*gl->bufferData)(0x90d2,(long)(int)dVar8,(void *)0x0,0x88e1);
    BufferMemMap::BufferMemMap((BufferMemMap *)local_570,gl,0x90d2,0,dVar8,2);
    memset((void *)local_560[0]._0_8_,0,(long)(int)dVar8);
    (*(code *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)((long)local_570 + 0x1670))->_M_allocated_capacity)(local_568);
    (*gl->bindBufferBase)(0x90d2,0,local_658.m_object);
    GVar6 = (*gl->getError)();
    glu::checkError(GVar6,"Output buffer setup failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fBasicComputeShaderTests.cpp"
                    ,0x59f);
    (*gl->useProgram)(local_3f0.m_program.m_program);
    p_Var4 = gl->uniform1ui;
    GVar9 = (*gl->getUniformLocation)(local_3f0.m_program.m_program,"u_baseVal");
    (*p_Var4)(GVar9,0x7f);
    (*gl->dispatchCompute)((this->m_workSize).m_data[0],(this->m_workSize).m_data[1],1);
    (*gl->memoryBarrier)(0x20);
    (*gl->useProgram)(local_5a8);
    (*gl->dispatchCompute)((this->m_workSize).m_data[0],(this->m_workSize).m_data[1],1);
    GVar6 = (*gl->getError)();
    glu::checkError(GVar6,"Failed to dispatch commands",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fBasicComputeShaderTests.cpp"
                    ,0x5a9);
    GVar7 = (*gl->getProgramResourceIndex)(local_5a8,0x92e6,"Output");
    dVar8 = glu::getProgramResourceUint(gl,local_5a8,0x92e6,GVar7,0x9303);
    GVar7 = (*gl->getProgramResourceIndex)(local_5a8,0x92e5,"sum");
    local_6c0.name._M_string_length = 0;
    local_6c0.name.field_2._M_local_buf[0] = '\0';
    local_6c0.index = 0xffffffff;
    local_6c0.blockIndex = 0xffffffff;
    local_6c0.atomicCounterBufferIndex = 0xffffffff;
    local_6c0.type = 0;
    local_6c0.arraySize = 0;
    local_6c0.offset = 0;
    local_6c0.arrayStride = 0;
    local_6c0._60_5_ = 0;
    local_6c0._65_8_ = 0;
    local_6c0.name._M_dataplus._M_p = (pointer)paVar1;
    glu::getProgramInterfaceVariableInfo(gl,local_5a8,0x92e5,GVar7,&local_6c0);
    iVar13 = 0;
    BufferMemMap::BufferMemMap(&local_670,gl,0x90d2,0,dVar8,1);
    iVar5 = (this->m_workSize).m_data[0] * (this->m_workSize).m_data[1];
    if (0 < iVar5) {
      iVar13 = iVar5 * 0x80 + (int)((ulong)(iVar5 - 2) * (ulong)(iVar5 - 1) >> 1) + -1;
    }
    if (*(int *)((long)local_670.m_ptr + (ulong)local_6c0.offset) == iVar13) {
      (*(local_670.m_gl)->unmapBuffer)(local_670.m_target);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6c0.name._M_dataplus._M_p != paVar1) {
        operator_delete(local_6c0.name._M_dataplus._M_p,
                        CONCAT71(local_6c0.name.field_2._M_allocated_capacity._1_7_,
                                 local_6c0.name.field_2._M_local_buf[0]) + 1);
      }
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
                 "Pass");
      glu::ObjectWrapper::~ObjectWrapper(&local_658);
      glu::ObjectWrapper::~ObjectWrapper((ObjectWrapper *)local_6e0);
      glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_640);
      glu::ShaderProgram::~ShaderProgram(&local_3f0);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
      std::ios_base::~ios_base((ios_base *)(local_320 + 0x70));
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
      return STOP;
    }
    local_570 = (undefined1  [8])
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_568);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_568,"ERROR: comparison failed, expected ",0x23);
    std::ostream::_M_insert<unsigned_long>((ulong)&local_568);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_568,", got ",6);
    std::ostream::_M_insert<unsigned_long>((ulong)&local_568);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_570,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_568);
    std::ios_base::~ios_base(local_4f8);
    pTVar12 = (TestError *)__cxa_allocate_exception(0x38);
    local_570 = (undefined1  [8])local_560;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_570,"Comparison failed","");
    tcu::TestError::TestError(pTVar12,(string *)local_570);
    __cxa_throw(pTVar12,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  pTVar12 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar12,"Compile failed",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fBasicComputeShaderTests.cpp"
             ,0x582);
  __cxa_throw(pTVar12,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

IterateResult iterate (void)
	{
		const GLSLVersion			glslVersion				= glu::getContextTypeGLSLVersion(m_context.getRenderContext().getType());
		const char* const			glslVersionDeclaration	= getGLSLVersionDeclaration(glslVersion);

		std::ostringstream src0;
		src0 << glslVersionDeclaration << "\n"
			 << "layout (local_size_x = 1) in;\n"
						  "uniform uint u_baseVal;\n"
						  "layout(r32ui, binding = 2) writeonly uniform highp uimage2D u_img;\n"
						  "void main (void) {\n"
						  "    uint offset = gl_NumWorkGroups.x*gl_NumWorkGroups.y*gl_WorkGroupID.z + gl_NumWorkGroups.x*gl_WorkGroupID.y + gl_WorkGroupID.x;\n"
						  "    imageStore(u_img, ivec2(gl_WorkGroupID.xy), uvec4(offset+u_baseVal, 0, 0, 0));\n"
				"}\n";

		std::ostringstream src1;
		src1 << glslVersionDeclaration << "\n"
			 << "layout (local_size_x = 1) in;\n"
						  "layout(r32ui, binding = 2) readonly uniform highp uimage2D u_img;\n"
						  "layout(binding = 0) buffer Output {\n"
						  "    coherent uint sum;\n"
						  "};\n"
						  "void main (void) {\n"
						  "    uint value = imageLoad(u_img, ivec2(gl_WorkGroupID.xy)).x;\n"
						  "    atomicAdd(sum, value);\n"
				"}\n";

		const ShaderProgram			program0		(m_context.getRenderContext(), ProgramSources() << ComputeSource(src0.str()));
		const ShaderProgram			program1		(m_context.getRenderContext(), ProgramSources() << ComputeSource(src1.str()));

		const glw::Functions&		gl				= m_context.getRenderContext().getFunctions();
		const Texture				tempTexture		(m_context.getRenderContext());
		const Buffer				outputBuffer	(m_context.getRenderContext());
		const deUint32				baseValue		= 127;

		m_testCtx.getLog() << program0 << program1;
		if (!program0.isOk() || !program1.isOk())
			TCU_FAIL("Compile failed");

		m_testCtx.getLog() << TestLog::Message << "Work groups: " << m_workSize << TestLog::EndMessage;

		// Temp texture setup
		gl.bindTexture(GL_TEXTURE_2D, *tempTexture);
		gl.texStorage2D(GL_TEXTURE_2D, 1, GL_R32UI, m_workSize[0], m_workSize[1]);
		gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Uploading image data failed");

		// Bind to unit 2
		gl.bindImageTexture(2, *tempTexture, 0, GL_FALSE, 0, GL_READ_WRITE, GL_R32UI);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Image setup failed");

		// Output buffer setup
		{
			const deUint32		blockIndex		= gl.getProgramResourceIndex(program1.getProgram(), GL_SHADER_STORAGE_BLOCK, "Output");
			const int			blockSize		= getProgramResourceInt(gl, program1.getProgram(), GL_SHADER_STORAGE_BLOCK, blockIndex, GL_BUFFER_DATA_SIZE);

			gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, *outputBuffer);
			gl.bufferData(GL_SHADER_STORAGE_BUFFER, blockSize, DE_NULL, GL_STREAM_READ);

			{
				const BufferMemMap bufMap(gl, GL_SHADER_STORAGE_BUFFER, 0, blockSize, GL_MAP_WRITE_BIT);
				deMemset(bufMap.getPtr(), 0, blockSize);
			}

			gl.bindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, *outputBuffer);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Output buffer setup failed");
		}

		// Dispatch compute workload
		gl.useProgram(program0.getProgram());
		gl.uniform1ui(gl.getUniformLocation(program0.getProgram(), "u_baseVal"), baseValue);
		gl.dispatchCompute(m_workSize[0], m_workSize[1], 1);
		gl.memoryBarrier(GL_SHADER_IMAGE_ACCESS_BARRIER_BIT);
		gl.useProgram(program1.getProgram());
		gl.dispatchCompute(m_workSize[0], m_workSize[1], 1);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to dispatch commands");

		// Read back and compare
		{
			const deUint32				blockIndex	= gl.getProgramResourceIndex(program1.getProgram(), GL_SHADER_STORAGE_BLOCK, "Output");
			const int					blockSize	= getProgramResourceInt(gl, program1.getProgram(), GL_SHADER_STORAGE_BLOCK, blockIndex, GL_BUFFER_DATA_SIZE);
			const deUint32				valueIndex	= gl.getProgramResourceIndex(program1.getProgram(), GL_BUFFER_VARIABLE, "sum");
			const InterfaceVariableInfo	valueInfo	= getProgramInterfaceVariableInfo(gl, program1.getProgram(), GL_BUFFER_VARIABLE, valueIndex);
			const BufferMemMap			bufMap		(gl, GL_SHADER_STORAGE_BUFFER, 0, blockSize, GL_MAP_READ_BIT);

			const deUint32				res			= *((const deUint32*)((const deUint8*)bufMap.getPtr() + valueInfo.offset));
			deUint32					ref			= 0;

			for (int ndx = 0; ndx < m_workSize[0]*m_workSize[1]; ndx++)
				ref += baseValue + (deUint32)ndx;

			if (res != ref)
			{
				m_testCtx.getLog() << TestLog::Message << "ERROR: comparison failed, expected " << ref << ", got " << res << TestLog::EndMessage;
				throw tcu::TestError("Comparison failed");
			}
		}

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		return STOP;
	}